

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> *node)

{
  long lVar1;
  long *in_RDX;
  pointer puVar2;
  pointer puVar3;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  new_args;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_80;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  local_78;
  long *local_58;
  _Head_base<0UL,_verilogAST::CallExpr_*,_false> local_50;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  local_48;
  
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = *in_RDX;
  puVar2 = *(pointer *)(lVar1 + 0x28);
  puVar3 = *(pointer *)(lVar1 + 0x30);
  if (puVar2 == puVar3) {
    local_78.
    super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_58 = in_RDX;
    local_50._M_head_impl = (CallExpr *)this;
    do {
      local_80._M_head_impl =
           (puVar2->_M_t).
           super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
           .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl;
      (puVar2->_M_t).
      super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
      _M_t.
      super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
      .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      (**(code **)(node->_M_t).
                  super___uniq_ptr_impl<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::CallExpr_*,_std::default_delete<verilogAST::CallExpr>_>
                  .super__Head_base<0UL,_verilogAST::CallExpr_*,_false>._M_head_impl)
                (&local_48,node,&local_80);
      std::
      vector<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::allocator<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>
                ((vector<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::allocator<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
                  *)&local_78,
                 (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *
                 )&local_48);
      if (local_48.
          super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_48.
                    super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[2].super_Node
                  ._vptr_Node)();
      }
      local_48.
      super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_80._M_head_impl != (Expression *)0x0) {
        (*((local_80._M_head_impl)->super_Node)._vptr_Node[2])();
      }
      local_80._M_head_impl = (Expression *)0x0;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar3);
    lVar1 = *local_58;
    puVar2 = *(pointer *)(lVar1 + 0x28);
    puVar3 = *(pointer *)(lVar1 + 0x30);
    this = (Transformer *)local_50._M_head_impl;
    in_RDX = local_58;
  }
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0x38);
  *(undefined4 *)(lVar1 + 0x28) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)(lVar1 + 0x2c) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)(lVar1 + 0x30) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)(lVar1 + 0x34) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(pointer *)(lVar1 + 0x38) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar2;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::~vector(&local_48);
  *this = (Transformer)*in_RDX;
  *in_RDX = 0;
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::~vector(&local_78);
  return (__uniq_ptr_data<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>,_true,_true>
          )(tuple<verilogAST::CallExpr_*,_std::default_delete<verilogAST::CallExpr>_>)this;
}

Assistant:

std::unique_ptr<CallExpr> Transformer::visit(std::unique_ptr<CallExpr> node) {
  std::vector<std::unique_ptr<Expression>> new_args;
  for (auto&& expr : node->args) {
    new_args.push_back(this->visit(std::move(expr)));
  }
  node->args = std::move(new_args);
  return node;
}